

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

deUint8 * __thiscall
deqp::gles3::Functional::MultiVertexArrayObjectTest::createRandomBufferData
          (MultiVertexArrayObjectTest *this,BufferSpec *buffer)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  float fVar5;
  undefined1 local_56;
  undefined1 local_55;
  undefined2 local_54;
  undefined2 local_52;
  GLubyte v_6;
  int iStack_50;
  GLbyte v_5;
  GLushort v_4;
  GLshort v_3;
  GLuint v_2;
  GLint v_1;
  float v;
  int componentNdx;
  deUint8 *componentItr;
  deUint8 *pdStack_30;
  int pos;
  deUint8 *itr;
  deUint8 *pdStack_20;
  int stride;
  deUint8 *data;
  BufferSpec *buffer_local;
  MultiVertexArrayObjectTest *this_local;
  
  data = (deUint8 *)buffer;
  buffer_local = (BufferSpec *)this;
  pdStack_30 = (deUint8 *)operator_new__((long)buffer->size);
  if (*(int *)(data + 0xc) == 0) {
    switch(*(undefined4 *)(data + 0x14)) {
    case 0x1400:
      itr._4_4_ = *(int *)(data + 8);
      break;
    case 0x1401:
      itr._4_4_ = *(int *)(data + 8);
      break;
    case 0x1402:
      itr._4_4_ = *(int *)(data + 8) << 1;
      break;
    case 0x1403:
      itr._4_4_ = *(int *)(data + 8) << 1;
      break;
    case 0x1404:
      itr._4_4_ = *(int *)(data + 8) << 2;
      break;
    case 0x1405:
      itr._4_4_ = *(int *)(data + 8) << 2;
      break;
    case 0x1406:
      itr._4_4_ = *(int *)(data + 8) << 2;
      break;
    default:
      itr._4_4_ = 0;
    }
  }
  else {
    itr._4_4_ = *(int *)(data + 0xc);
  }
  pdStack_20 = pdStack_30;
  for (componentItr._4_4_ = 0; componentItr._4_4_ < *(int *)data;
      componentItr._4_4_ = componentItr._4_4_ + 1) {
    _v = pdStack_30;
    for (v_1 = 0; v_1 < *(int *)(data + 8); v_1 = v_1 + 1) {
      switch(*(undefined4 *)(data + 0x14)) {
      case 0x1400:
        iVar4 = de::Random::getInt(&this->m_random,*(int *)(data + 0x18),*(int *)(data + 0x1c));
        local_55 = (undefined1)iVar4;
        ::deMemcpy(_v,&local_55,1);
        _v = _v + 1;
        break;
      case 0x1401:
        iVar4 = de::Random::getInt(&this->m_random,*(int *)(data + 0x18),*(int *)(data + 0x1c));
        local_56 = (undefined1)iVar4;
        ::deMemcpy(_v,&local_56,1);
        _v = _v + 1;
        break;
      case 0x1402:
        iVar4 = de::Random::getInt(&this->m_random,*(int *)(data + 0x18),*(int *)(data + 0x1c));
        local_52 = (undefined2)iVar4;
        ::deMemcpy(_v,&local_52,2);
        _v = _v + 2;
        break;
      case 0x1403:
        iVar4 = de::Random::getInt(&this->m_random,*(int *)(data + 0x18),*(int *)(data + 0x1c));
        local_54 = (undefined2)iVar4;
        ::deMemcpy(_v,&local_54,2);
        _v = _v + 2;
        break;
      case 0x1404:
        _v_4 = de::Random::getInt(&this->m_random,*(int *)(data + 0x18),*(int *)(data + 0x1c));
        ::deMemcpy(_v,&v_4,4);
        _v = _v + 4;
        break;
      case 0x1405:
        iStack_50 = de::Random::getInt(&this->m_random,*(int *)(data + 0x18),*(int *)(data + 0x1c));
        ::deMemcpy(_v,&stack0xffffffffffffffb0,4);
        _v = _v + 4;
        break;
      case 0x1406:
        fVar1 = *(float *)(data + 0x20);
        fVar2 = *(float *)(data + 0x24);
        fVar3 = *(float *)(data + 0x20);
        fVar5 = de::Random::getFloat(&this->m_random);
        v_2 = (GLuint)((fVar2 - fVar3) * fVar5 + fVar1);
        ::deMemcpy(_v,&v_2,4);
        _v = _v + 4;
      }
    }
    pdStack_30 = pdStack_30 + itr._4_4_;
  }
  return pdStack_20;
}

Assistant:

deUint8* MultiVertexArrayObjectTest::createRandomBufferData (const BufferSpec& buffer)
{
	deUint8* data = new deUint8[buffer.size];

	int stride;

	if (buffer.stride != 0)
	{
		stride = buffer.stride;
	}
	else
	{
		switch (buffer.type)
		{
			case GL_FLOAT:			stride = buffer.componentCount * (int)sizeof(GLfloat);	break;
			case GL_INT:			stride = buffer.componentCount * (int)sizeof(GLint);	break;
			case GL_UNSIGNED_INT:	stride = buffer.componentCount * (int)sizeof(GLuint);	break;
			case GL_SHORT:			stride = buffer.componentCount * (int)sizeof(GLshort);	break;
			case GL_UNSIGNED_SHORT:	stride = buffer.componentCount * (int)sizeof(GLushort);	break;
			case GL_BYTE:			stride = buffer.componentCount * (int)sizeof(GLbyte);	break;
			case GL_UNSIGNED_BYTE:	stride = buffer.componentCount * (int)sizeof(GLubyte);	break;

			default:
				stride = 0;
				DE_ASSERT(DE_FALSE);
		}
	}

	deUint8* itr = data;

	for (int pos = 0; pos < buffer.count; pos++)
	{
		deUint8* componentItr = itr;
		for (int componentNdx = 0; componentNdx < buffer.componentCount; componentNdx++)
		{
			switch (buffer.type)
			{
				case GL_FLOAT:
				{
					float v = buffer.floatRangeMin + (buffer.floatRangeMax - buffer.floatRangeMin) * m_random.getFloat();
					deMemcpy(componentItr, &v, sizeof(v));
					componentItr += sizeof(v);
					break;
				}

				case GL_INT:
				{
					GLint v = m_random.getInt(buffer.intRangeMin, buffer.intRangeMax);
					deMemcpy(componentItr, &v, sizeof(v));
					componentItr += sizeof(v);
					break;
				}

				case GL_UNSIGNED_INT:
				{
					GLuint v = (GLuint)m_random.getInt(buffer.intRangeMin, buffer.intRangeMax);
					deMemcpy(componentItr, &v, sizeof(v));
					componentItr += sizeof(v);
					break;
				}

				case GL_SHORT:
				{
					GLshort v = (GLshort)m_random.getInt(buffer.intRangeMin, buffer.intRangeMax);
					deMemcpy(componentItr, &v, sizeof(v));
					componentItr += sizeof(v);
					break;
				}

				case GL_UNSIGNED_SHORT:
				{
					GLushort v = (GLushort)m_random.getInt(buffer.intRangeMin, buffer.intRangeMax);
					deMemcpy(componentItr, &v, sizeof(v));
					componentItr += sizeof(v);
					break;
				}

				case GL_BYTE:
				{
					GLbyte v = (GLbyte)m_random.getInt(buffer.intRangeMin, buffer.intRangeMax);
					deMemcpy(componentItr, &v, sizeof(v));
					componentItr += sizeof(v);
					break;
				}

				case GL_UNSIGNED_BYTE:
				{
					GLubyte v = (GLubyte)m_random.getInt(buffer.intRangeMin, buffer.intRangeMax);
					deMemcpy(componentItr, &v, sizeof(v));
					componentItr += sizeof(v);
					break;
				}

				default:
					DE_ASSERT(false);
			};
		}

		itr += stride;
	}

	return data;
}